

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clause.cpp
# Opt level: O3

uint __thiscall Kernel::Clause::computeWeightForClauseSelection(Clause *this,Options *opt)

{
  SplitSet *pSVar1;
  long lVar2;
  uint numeralWeight;
  ulong uVar3;
  Term *pTVar4;
  ulong uVar5;
  uint uVar6;
  bool bVar7;
  uint splitWeight;
  NonVariableNonTypeIterator local_68;
  
  uVar6 = this->_weight;
  if (uVar6 == 0) {
    uVar3 = *(ulong *)&this->field_0x38 & 0xfffff;
    if (uVar3 == 0) {
      uVar6 = 0;
    }
    else {
      uVar6 = 0;
      do {
        uVar6 = uVar6 + (this->_literals[uVar3 - 1]->super_Term)._weight;
        bVar7 = 1 < uVar3;
        uVar3 = uVar3 - 1;
      } while (bVar7);
    }
  }
  numeralWeight = 0;
  splitWeight = 0;
  if (((opt->_nonliteralsInClauseWeight).super_OptionValue<bool>.super_AbstractOptionValue.
       field_0x92 == '\x01') &&
     (pSVar1 = (this->super_Unit)._inference._splits, pSVar1 != (SplitSet *)0x0)) {
    splitWeight = (uint)pSVar1->_size;
  }
  if ((opt->_increasedNumeralWeight).super_OptionValue<bool>.super_AbstractOptionValue.field_0x92 ==
      '\x01') {
    numeralWeight = getNumeralWeight(this);
  }
  if ((undefined1  [48])((undefined1  [48])(this->super_Unit)._inference & (undefined1  [48])0x18)
      != (undefined1  [48])0x0) {
    bVar7 = true;
    if ((opt->_restrictNWCtoGC).super_OptionValue<bool>.super_AbstractOptionValue.field_0x92 !=
        '\x01') goto LAB_00518ddb;
    if ((*(uint *)&this->field_0x38 & 0xfffff) != 0) {
      uVar3 = 0;
      bVar7 = false;
      do {
        NonVariableNonTypeIterator::NonVariableNonTypeIterator
                  (&local_68,&this->_literals[uVar3]->super_Term,false);
        while (lVar2 = DAT_00b521b0, local_68._stack._cursor != local_68._stack._stack) {
          pTVar4 = NonVariableNonTypeIterator::next(&local_68);
          bVar7 = (bool)(bVar7 | (*(byte *)(*(long *)(*(long *)(lVar2 + 0x60) +
                                                     (ulong)pTVar4->_functor * 8) + 0x41) & 0x40) >>
                                 6);
        }
        local_68.super_IteratorCore<Kernel::Term_*>._vptr_IteratorCore =
             (_func_int **)&PTR__NonVariableNonTypeIterator_00b3db90;
        if (local_68._stack._stack != (Term **)0x0) {
          uVar5 = local_68._stack._capacity * 8 + 0xf & 0xfffffffffffffff0;
          if (uVar5 == 0) {
            *local_68._stack._stack = (Term *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
            Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_68._stack._stack;
          }
          else if (uVar5 < 0x11) {
            *local_68._stack._stack = (Term *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
            Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = local_68._stack._stack;
          }
          else if (uVar5 < 0x19) {
            *local_68._stack._stack = (Term *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
            Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = local_68._stack._stack;
          }
          else if (uVar5 < 0x21) {
            *local_68._stack._stack = (Term *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
            Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_68._stack._stack;
          }
          else if (uVar5 < 0x31) {
            *local_68._stack._stack = (Term *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
            Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_68._stack._stack;
          }
          else if (uVar5 < 0x41) {
            *local_68._stack._stack = (Term *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
            Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_68._stack._stack;
          }
          else {
            ::operator_delete(local_68._stack._stack,0x10);
          }
        }
        uVar3 = uVar3 + 1;
      } while (uVar3 < ((uint)*(undefined8 *)&this->field_0x38 & 0xfffff));
      goto LAB_00518ddb;
    }
  }
  bVar7 = false;
LAB_00518ddb:
  uVar6 = computeWeightForClauseSelection(uVar6,splitWeight,numeralWeight,bVar7,opt);
  return uVar6;
}

Assistant:

unsigned Clause::computeWeightForClauseSelection(const Options& opt) const
{
  unsigned w = 0;
  if (_weight) {
    w = _weight;
  } else {
    w = computeWeight();
  }

  unsigned splWeight = 0;
  if (opt.nonliteralsInClauseWeight()) {
    splWeight = splitWeight(); // no longer includes propWeight
  }

  // hack: computation of getNumeralWeight is potentially expensive, so we only compute it if
  // the option increasedNumeralWeight is set to true.
  unsigned numeralWeight = 0;
  if (opt.increasedNumeralWeight())
  {
    numeralWeight = getNumeralWeight();
  }

  bool derivedFromGoal = Unit::derivedFromGoal();
  if(derivedFromGoal && opt.restrictNWCtoGC()){
    bool found = false;
    for(unsigned i=0;i<_length;i++){
      NonVariableNonTypeIterator it(_literals[i]);
      while(it.hasNext()){
        found |= env.signature->getFunction(it.next()->functor())->inGoal();
      }
    }
    if(!found){ derivedFromGoal=false; }
  }

  return Clause::computeWeightForClauseSelection(w, splWeight, numeralWeight, derivedFromGoal, opt);
}